

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status kwssys::SystemTools::FileTimeCompare(string *f1,string *f2,int *result)

{
  int iVar1;
  char *pcVar2;
  undefined4 *in_RDX;
  stat s2;
  stat s1;
  stat local_140;
  stat local_b0;
  undefined4 *local_20;
  Status local_8;
  
  *in_RDX = 0;
  local_20 = in_RDX;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(pcVar2,&local_b0);
  if (iVar1 == 0) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = stat(pcVar2,&local_140);
    if (iVar1 == 0) {
      if (local_b0.st_mtim.tv_sec < local_140.st_mtim.tv_sec) {
        *local_20 = 0xffffffff;
      }
      else if (local_140.st_mtim.tv_sec < local_b0.st_mtim.tv_sec) {
        *local_20 = 1;
      }
      else if (local_b0.st_mtim.tv_nsec < local_140.st_mtim.tv_nsec) {
        *local_20 = 0xffffffff;
      }
      else if (local_140.st_mtim.tv_nsec < local_b0.st_mtim.tv_nsec) {
        *local_20 = 1;
      }
      local_8 = Status::Success();
    }
    else {
      local_8 = Status::POSIX_errno();
    }
  }
  else {
    local_8 = Status::POSIX_errno();
  }
  return local_8;
}

Assistant:

Status SystemTools::FileTimeCompare(std::string const& f1,
                                    std::string const& f2, int* result)
{
  // Default to same time.
  *result = 0;
#if !defined(_WIN32) || defined(__CYGWIN__)
  // POSIX version.  Use stat function to get file modification time.
  struct stat s1;
  if (stat(f1.c_str(), &s1) != 0) {
    return Status::POSIX_errno();
  }
  struct stat s2;
  if (stat(f2.c_str(), &s2) != 0) {
    return Status::POSIX_errno();
  }
#  if KWSYS_CXX_STAT_HAS_ST_MTIM
  // Compare using nanosecond resolution.
  if (s1.st_mtim.tv_sec < s2.st_mtim.tv_sec) {
    *result = -1;
  } else if (s1.st_mtim.tv_sec > s2.st_mtim.tv_sec) {
    *result = 1;
  } else if (s1.st_mtim.tv_nsec < s2.st_mtim.tv_nsec) {
    *result = -1;
  } else if (s1.st_mtim.tv_nsec > s2.st_mtim.tv_nsec) {
    *result = 1;
  }
#  elif KWSYS_CXX_STAT_HAS_ST_MTIMESPEC
  // Compare using nanosecond resolution.
  if (s1.st_mtimespec.tv_sec < s2.st_mtimespec.tv_sec) {
    *result = -1;
  } else if (s1.st_mtimespec.tv_sec > s2.st_mtimespec.tv_sec) {
    *result = 1;
  } else if (s1.st_mtimespec.tv_nsec < s2.st_mtimespec.tv_nsec) {
    *result = -1;
  } else if (s1.st_mtimespec.tv_nsec > s2.st_mtimespec.tv_nsec) {
    *result = 1;
  }
#  else
  // Compare using 1 second resolution.
  if (s1.st_mtime < s2.st_mtime) {
    *result = -1;
  } else if (s1.st_mtime > s2.st_mtime) {
    *result = 1;
  }
#  endif
#else
  // Windows version.  Get the modification time from extended file attributes.
  WIN32_FILE_ATTRIBUTE_DATA f1d;
  WIN32_FILE_ATTRIBUTE_DATA f2d;
  if (!GetFileAttributesExW(Encoding::ToWindowsExtendedPath(f1).c_str(),
                            GetFileExInfoStandard, &f1d)) {
    return Status::Windows_GetLastError();
  }
  if (!GetFileAttributesExW(Encoding::ToWindowsExtendedPath(f2).c_str(),
                            GetFileExInfoStandard, &f2d)) {
    return Status::Windows_GetLastError();
  }

  // Compare the file times using resolution provided by system call.
  *result = (int)CompareFileTime(&f1d.ftLastWriteTime, &f2d.ftLastWriteTime);
#endif
  return Status::Success();
}